

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqContextManager.cpp
# Opt level: O1

shared_ptr<ZmqContextManager> __thiscall
ZmqContextManager::getContextPointer(ZmqContextManager *this,string *contextName)

{
  _Base_ptr p_Var1;
  int iVar2;
  iterator iVar3;
  ZmqContextManager *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ZmqContextManager> sVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&contextLock);
  if (iVar2 == 0) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ZmqContextManager>_>_>_>
            ::find(&contexts_abi_cxx11_._M_t,contextName);
    if ((_Rb_tree_header *)iVar3._M_node == &contexts_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
    {
      this_00 = (ZmqContextManager *)operator_new(0x30);
      ZmqContextManager(this_00,contextName);
      (this->name)._M_dataplus._M_p = (pointer)this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ZmqContextManager*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this->name)._M_string_length,
                 this_00);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<ZmqContextManager>&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<ZmqContextManager>>>>
                  *)&contexts_abi_cxx11_,contextName,(shared_ptr<ZmqContextManager> *)this);
    }
    else {
      (this->name)._M_dataplus._M_p = *(pointer *)(iVar3._M_node + 2);
      p_Var1 = iVar3._M_node[2]._M_parent;
      (this->name)._M_string_length = (size_type)p_Var1;
      if (p_Var1 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var1->_M_parent = *(int *)&p_Var1->_M_parent + 1;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&contextLock);
    sVar4.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<ZmqContextManager>)
           sVar4.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

std::shared_ptr<ZmqContextManager>
    ZmqContextManager::getContextPointer(const std::string& contextName)
{
    std::lock_guard<std::mutex> conlock(
        contextLock);  // just to ensure that nothing funny happens if you try to
    // get a context while it is being constructed
    auto fnd = contexts.find(contextName);
    if (fnd != contexts.end()) {
        return fnd->second;
    }
    // std::cout << "creating context in " << std::this_thread::get_id() << std::endl;
    auto newContext = std::shared_ptr<ZmqContextManager>(new ZmqContextManager(contextName));
    contexts.emplace(contextName, newContext);
    return newContext;
    // if it doesn't make a new one with the appropriate name
}